

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurse.cpp
# Opt level: O0

Nurse * __thiscall Nurse::Field_getter_abi_cxx11_(Nurse *this)

{
  long in_RSI;
  Nurse *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x120));
  return this;
}

Assistant:

string Nurse :: Field_getter(){
    return Field;
}